

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O3

void __thiscall
miniros::MasterLink::setParamImpl<float>
          (MasterLink *this,string *key,vector<float,_std::allocator<float>_> *vec)

{
  long lVar1;
  XmlRpcValue *this_00;
  ulong uVar2;
  RpcValue xml_vec;
  XmlRpcValue local_48;
  double local_38;
  
  local_48._type = TypeInvalid;
  local_48._value.asDouble = 0.0;
  XmlRpc::XmlRpcValue::assertArray(&local_48,(int)((ulong)(*(long *)(vec + 8) - *(long *)vec) >> 2))
  ;
  lVar1 = *(long *)vec;
  if (*(long *)(vec + 8) != lVar1) {
    uVar2 = 0;
    do {
      local_38 = (double)*(float *)(lVar1 + uVar2 * 4);
      this_00 = XmlRpc::XmlRpcValue::operator[](&local_48,(int)uVar2);
      XmlRpc::XmlRpcValue::operator=(this_00,&local_38);
      uVar2 = uVar2 + 1;
      lVar1 = *(long *)vec;
    } while (uVar2 < (ulong)(*(long *)(vec + 8) - lVar1 >> 2));
  }
  set(this,key,&local_48);
  XmlRpc::XmlRpcValue::invalidate(&local_48);
  return;
}

Assistant:

void MasterLink::setParamImpl(const std::string& key, const std::vector<T>& vec)
{
  // Note: the XmlRpcValue starts off as "invalid" and assertArray turns it
  // into an array type with the given size
  RpcValue xml_vec;
  xml_vec.setSize(vec.size());

  // Copy the contents into the XmlRpcValue
  for (size_t i = 0; i < vec.size(); i++) {
    xml_vec[i] = vec.at(i);
  }

  this->set(key, xml_vec);
}